

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfZip.cpp
# Opt level: O0

int __thiscall Imf_3_4::Zip::uncompress(Zip *this,char *compressed,int compressedSize,char *raw)

{
  int iVar1;
  InputExc *this_00;
  undefined8 in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  size_t outSize;
  long local_30;
  undefined8 local_28;
  int local_4;
  
  local_30 = 0;
  local_28 = in_RCX;
  iVar1 = exr_uncompress_buffer(0,in_RSI,(long)in_EDX,in_RDI[1],*in_RDI,&local_30);
  if (iVar1 != 0) {
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::InputExc::InputExc(this_00,"Data decompression failed.");
    __cxa_throw(this_00,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
  }
  if (local_30 == 0) {
    local_4 = 0;
  }
  else {
    (*(code *)(anonymous_namespace)::reconstruct)(in_RDI[1],local_30);
    (*(code *)(anonymous_namespace)::interleave)(in_RDI[1],local_30,local_28);
    local_4 = (int)local_30;
  }
  return local_4;
}

Assistant:

int
Zip::uncompress (const char* compressed, int compressedSize, char* raw)
{
    size_t outSize = 0;
    if (EXR_ERR_SUCCESS != exr_uncompress_buffer (
                               nullptr,
                               compressed,
                               (size_t) compressedSize,
                               _tmpBuffer,
                               _maxRawSize,
                               &outSize))
    {
        throw IEX_NAMESPACE::InputExc ("Data decompression failed.");
    }

    if (outSize == 0) { return static_cast<int> (outSize); }

    //
    // Predictor.
    //
    reconstruct (_tmpBuffer, outSize);

    //
    // Reorder the pixel data.
    //
    interleave (_tmpBuffer, outSize, raw);

    return outSize;
}